

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Method.cpp
# Opt level: O3

int Lodtalk::CompiledMethod::stObjectAtPut(InterpreterProxy *interpreter)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 extraout_RDX;
  ulong uVar4;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) != 2) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  uVar2 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
  iVar3 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,1);
  if ((((uVar2 & 1) != 0) && (uVar4 = CONCAT44(extraout_var_01,uVar2) >> 1, 0 < (long)uVar4)) &&
     (uVar4 <= (ulong)(*(uint *)(CONCAT44(extraout_var_00,iVar1) + 8) >> 1 & 0xffff) + 1)) {
    *(ulong *)(CONCAT44(extraout_var_00,iVar1) + uVar4 * 8) = CONCAT44(extraout_var_02,iVar3);
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x17])
                      (interpreter,CONCAT44(extraout_var_02,iVar3),extraout_RDX,
                       interpreter->_vptr_InterpreterProxy[0x17]);
    return iVar1;
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
  return iVar1;
}

Assistant:

int CompiledMethod::stObjectAtPut(InterpreterProxy *interpreter)
{
    if (interpreter->getArgumentCount() != 2)
        return interpreter->primitiveFailed();

    auto selfOop = interpreter->getReceiver();
    auto self = reinterpret_cast<CompiledMethod*> (selfOop.pointer);

    auto indexOop = interpreter->getTemporary(0);
    auto valueOop = interpreter->getTemporary(1);
    if (!indexOop.isSmallInteger())
        return interpreter->primitiveFailed();

    auto index = indexOop.decodeSmallInteger();
    if (index < 1 || index > (SmallIntegerValue)self->getLiteralCount() + 1)
        return interpreter->primitiveFailed();

    reinterpret_cast<Oop*> (self->getFirstFieldPointer())[index - 1] = valueOop;
    return interpreter->returnOop(valueOop);
}